

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_scan_avx2_256_8.c
# Opt level: O1

void arr_store_si256(int *array,__m256i vH,int32_t t,int32_t seglen,int32_t d,int32_t dlen)

{
  ulong uVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char in_XMM0_Ba;
  char in_XMM0_Bb;
  char in_XMM0_Bc;
  char in_XMM0_Bd;
  char in_XMM0_Be;
  char in_XMM0_Bf;
  char in_XMM0_Bg;
  char in_XMM0_Bh;
  char in_YMM0_H;
  char in_register_00001211;
  char in_register_00001212;
  char in_register_00001213;
  char in_register_00001214;
  char in_register_00001215;
  char in_register_00001216;
  char in_register_00001217;
  
  uVar1 = (ulong)(uint)dlen;
  lVar2 = (long)d;
  array[uVar1 * (long)t + lVar2] = (int)in_XMM0_Ba;
  array[uVar1 * (long)(seglen + t) + lVar2] = (int)in_XMM0_Bb;
  array[(long)(t + seglen * 2) * uVar1 + lVar2] = (int)in_XMM0_Bc;
  array[(long)(seglen * 3 + t) * uVar1 + lVar2] = (int)in_XMM0_Bd;
  array[(long)(t + seglen * 4) * uVar1 + lVar2] = (int)in_XMM0_Be;
  array[(long)(seglen * 5 + t) * uVar1 + lVar2] = (int)in_XMM0_Bf;
  array[(long)(t + seglen * 6) * uVar1 + lVar2] = (int)in_XMM0_Bg;
  iVar3 = t + seglen * 10;
  array[(long)(seglen * 7 + t) * uVar1 + lVar2] = (int)in_XMM0_Bh;
  array[(long)(t + seglen * 8) * uVar1 + lVar2] = (int)in_XMM0_Ba;
  iVar4 = t + seglen * 0xc;
  array[(long)(seglen * 9 + t) * uVar1 + lVar2] = (int)in_XMM0_Bb;
  array[(long)iVar3 * uVar1 + lVar2] = (int)in_XMM0_Bc;
  array[(long)(iVar3 + seglen) * uVar1 + lVar2] = (int)in_XMM0_Bd;
  array[(long)iVar4 * uVar1 + lVar2] = (int)in_XMM0_Be;
  array[(long)(iVar4 + seglen) * uVar1 + lVar2] = (int)in_XMM0_Bf;
  array[(long)(seglen * 0xe + t) * uVar1 + lVar2] = (int)in_XMM0_Bg;
  iVar3 = t + seglen * 0x12;
  array[(long)(seglen * 0xf + t) * uVar1 + lVar2] = (int)in_XMM0_Bh;
  array[(long)(t + seglen * 0x10) * uVar1 + lVar2] = (int)in_YMM0_H;
  iVar4 = t + seglen * 0x14;
  array[(long)(seglen + t + seglen * 0x10) * uVar1 + lVar2] = (int)in_register_00001211;
  array[(long)iVar3 * uVar1 + lVar2] = (int)in_register_00001212;
  iVar5 = seglen * 0x19 + t;
  array[(long)(iVar3 + seglen) * uVar1 + lVar2] = (int)in_register_00001213;
  iVar3 = seglen * 0x1b + t;
  array[(long)iVar4 * uVar1 + lVar2] = (int)in_register_00001214;
  array[(long)(iVar4 + seglen) * uVar1 + lVar2] = (int)in_register_00001215;
  array[(long)(iVar4 + seglen * 2) * uVar1 + lVar2] = (int)in_register_00001216;
  array[(long)(seglen * 0x17 + t) * uVar1 + lVar2] = (int)in_register_00001217;
  array[(long)(t + seglen * 0x18) * uVar1 + lVar2] = (int)in_YMM0_H;
  array[(long)iVar5 * uVar1 + lVar2] = (int)in_register_00001211;
  array[(long)(iVar5 + seglen) * uVar1 + lVar2] = (int)in_register_00001212;
  array[(long)iVar3 * uVar1 + lVar2] = (int)in_register_00001213;
  array[(long)(iVar3 + seglen) * uVar1 + lVar2] = (int)in_register_00001214;
  array[(long)(iVar3 + seglen * 2) * uVar1 + lVar2] = (int)in_register_00001215;
  array[(long)(seglen * 0x1e + t) * uVar1 + lVar2] = (int)in_register_00001216;
  array[(long)(seglen * 0x1f + t) * uVar1 + lVar2] = (int)in_register_00001217;
  return;
}

Assistant:

static inline void arr_store_si256(
        int *array,
        __m256i vH,
        int32_t t,
        int32_t seglen,
        int32_t d,
        int32_t dlen)
{
    array[1LL*( 0*seglen+t)*dlen + d] = (int8_t)_mm256_extract_epi8_rpl(vH,  0);
    array[1LL*( 1*seglen+t)*dlen + d] = (int8_t)_mm256_extract_epi8_rpl(vH,  1);
    array[1LL*( 2*seglen+t)*dlen + d] = (int8_t)_mm256_extract_epi8_rpl(vH,  2);
    array[1LL*( 3*seglen+t)*dlen + d] = (int8_t)_mm256_extract_epi8_rpl(vH,  3);
    array[1LL*( 4*seglen+t)*dlen + d] = (int8_t)_mm256_extract_epi8_rpl(vH,  4);
    array[1LL*( 5*seglen+t)*dlen + d] = (int8_t)_mm256_extract_epi8_rpl(vH,  5);
    array[1LL*( 6*seglen+t)*dlen + d] = (int8_t)_mm256_extract_epi8_rpl(vH,  6);
    array[1LL*( 7*seglen+t)*dlen + d] = (int8_t)_mm256_extract_epi8_rpl(vH,  7);
    array[1LL*( 8*seglen+t)*dlen + d] = (int8_t)_mm256_extract_epi8_rpl(vH,  8);
    array[1LL*( 9*seglen+t)*dlen + d] = (int8_t)_mm256_extract_epi8_rpl(vH,  9);
    array[1LL*(10*seglen+t)*dlen + d] = (int8_t)_mm256_extract_epi8_rpl(vH, 10);
    array[1LL*(11*seglen+t)*dlen + d] = (int8_t)_mm256_extract_epi8_rpl(vH, 11);
    array[1LL*(12*seglen+t)*dlen + d] = (int8_t)_mm256_extract_epi8_rpl(vH, 12);
    array[1LL*(13*seglen+t)*dlen + d] = (int8_t)_mm256_extract_epi8_rpl(vH, 13);
    array[1LL*(14*seglen+t)*dlen + d] = (int8_t)_mm256_extract_epi8_rpl(vH, 14);
    array[1LL*(15*seglen+t)*dlen + d] = (int8_t)_mm256_extract_epi8_rpl(vH, 15);
    array[1LL*(16*seglen+t)*dlen + d] = (int8_t)_mm256_extract_epi8_rpl(vH, 16);
    array[1LL*(17*seglen+t)*dlen + d] = (int8_t)_mm256_extract_epi8_rpl(vH, 17);
    array[1LL*(18*seglen+t)*dlen + d] = (int8_t)_mm256_extract_epi8_rpl(vH, 18);
    array[1LL*(19*seglen+t)*dlen + d] = (int8_t)_mm256_extract_epi8_rpl(vH, 19);
    array[1LL*(20*seglen+t)*dlen + d] = (int8_t)_mm256_extract_epi8_rpl(vH, 20);
    array[1LL*(21*seglen+t)*dlen + d] = (int8_t)_mm256_extract_epi8_rpl(vH, 21);
    array[1LL*(22*seglen+t)*dlen + d] = (int8_t)_mm256_extract_epi8_rpl(vH, 22);
    array[1LL*(23*seglen+t)*dlen + d] = (int8_t)_mm256_extract_epi8_rpl(vH, 23);
    array[1LL*(24*seglen+t)*dlen + d] = (int8_t)_mm256_extract_epi8_rpl(vH, 24);
    array[1LL*(25*seglen+t)*dlen + d] = (int8_t)_mm256_extract_epi8_rpl(vH, 25);
    array[1LL*(26*seglen+t)*dlen + d] = (int8_t)_mm256_extract_epi8_rpl(vH, 26);
    array[1LL*(27*seglen+t)*dlen + d] = (int8_t)_mm256_extract_epi8_rpl(vH, 27);
    array[1LL*(28*seglen+t)*dlen + d] = (int8_t)_mm256_extract_epi8_rpl(vH, 28);
    array[1LL*(29*seglen+t)*dlen + d] = (int8_t)_mm256_extract_epi8_rpl(vH, 29);
    array[1LL*(30*seglen+t)*dlen + d] = (int8_t)_mm256_extract_epi8_rpl(vH, 30);
    array[1LL*(31*seglen+t)*dlen + d] = (int8_t)_mm256_extract_epi8_rpl(vH, 31);
}